

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdHist.c
# Opt level: O1

void Cmd_HistoryWrite(Abc_Frame_t *p,int Limit)

{
  return;
}

Assistant:

void Cmd_HistoryWrite( Abc_Frame_t * p, int Limit )
{
#if defined(WIN32) 
    FILE * pFile;
    char * pStr; 
    int i;
    pFile = fopen( "abc.history", "wb" );
    if ( pFile == NULL )
    {
        Abc_Print( 0, "Cannot open file \"abc.history\" for writing.\n" );
        return;
    }
    Limit = Abc_MaxInt( 0, Vec_PtrSize(p->aHistory)-Limit );
    Vec_PtrForEachEntryStart( char *, p->aHistory, pStr, i, Limit )
        fprintf( pFile, "%s\n", pStr );
    fclose( pFile );
#endif
}